

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O3

qpdf_stream_decode_level_e __thiscall
qpdf::Stream::writeStreamJSON
          (Stream *this,int json_version,Writer *jw,qpdf_json_stream_data_e json_data,
          qpdf_stream_decode_level_e decode_level,Pipeline *p,string *data_filename,bool no_data_key
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  logic_error *plVar3;
  Writer *pWVar4;
  Writer *pWVar5;
  int iVar6;
  Pl_Buffer *pipeline;
  bool bVar7;
  string_view sv;
  bool filtered;
  QPDFObjectHandle dict;
  Pl_Buffer buf_pl;
  Pl_Discard discard;
  bool local_111;
  string local_110;
  qpdf_json_stream_data_e local_ec;
  Writer *local_e8;
  int local_dc;
  QPDFObjectHandle local_d8;
  Members *local_c8;
  Pipeline *local_c0;
  Pl_Buffer local_b8;
  string local_80;
  Pl_Discard local_60;
  
  local_dc = json_version;
  local_c8 = stream(this);
  local_ec = json_data;
  if (json_data < qpdf_sj_file) {
    if (p != (Pipeline *)0x0) {
      plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error
                (plVar3,
                 "QPDF_Stream::writeStreamJSON: pipeline should only be supplied when json_data is file"
                );
      goto LAB_001fd699;
    }
  }
  else if (json_data == qpdf_sj_file) {
    if (p == (Pipeline *)0x0) {
      plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error
                (plVar3,
                 "QPDF_Stream::writeStreamJSON: pipeline must be supplied when json_data is file");
LAB_001fd699:
      __cxa_throw(plVar3,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    if (data_filename->_M_string_length == 0) {
      plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error
                (plVar3,
                 "QPDF_Stream::writeStreamJSON: data_filename must be supplied when json_data is file"
                );
      goto LAB_001fd699;
    }
  }
  local_b8.super_Pipeline._vptr_Pipeline._0_1_ = 0x7b;
  (*jw->p->_vptr_Pipeline[2])(jw->p,&local_b8,1);
  jw->first = true;
  jw->indent = jw->indent + 2;
  if (local_ec == qpdf_sj_none) {
    JSON::Writer::writeNext(jw);
    (*jw->p->_vptr_Pipeline[2])(jw->p,"\"dict\": ",8);
    QPDFObjectHandle::writeJSON(&local_c8->stream_dict,local_dc,jw,false);
    local_b8.super_Pipeline._vptr_Pipeline._0_1_ = 0x7d;
    JSON::Writer::writeEnd(jw,(char *)&local_b8);
    return decode_level;
  }
  local_e8 = jw;
  local_c0 = p;
  Pl_Discard::Pl_Discard(&local_60);
  Pl_Buffer::Pl_Buffer(&local_b8,"stream data",(Pipeline *)0x0);
  pipeline = (Pl_Buffer *)&local_60;
  if (!no_data_key) {
    pipeline = &local_b8;
  }
  if (local_ec != qpdf_sj_inline) {
    pipeline = &local_b8;
  }
  local_111 = false;
  bVar7 = decode_level != qpdf_dl_none;
  iVar6 = 2;
  while ((bVar2 = pipeStreamData(this,&pipeline->super_Pipeline,&local_111,0,decode_level,false,
                                 iVar6 == 2), !bVar2 || ((bVar7 && (local_111 == false))))) {
    Pl_Buffer::getString_abi_cxx11_(&local_80,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    decode_level = qpdf_dl_none;
    bVar7 = false;
    iVar6 = iVar6 + -1;
    if (iVar6 == 0) {
      plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar3,"QPDF_Stream: failed to get stream data");
      __cxa_throw(plVar3,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
  }
  QPDFObjectHandle::unsafeShallowCopy(&local_d8);
  paVar1 = &local_110.field_2;
  local_110._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"/Length","");
  QPDFObjectHandle::removeKey(&local_d8,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar1) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  pWVar4 = local_e8;
  if ((bVar7) && (local_111 == true)) {
    local_110._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"/Filter","");
    QPDFObjectHandle::removeKey(&local_d8,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar1) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    local_110._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"/DecodeParms","");
    QPDFObjectHandle::removeKey(&local_d8,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar1) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_ec == qpdf_sj_file) {
    pWVar4 = JSON::Writer::writeNext(pWVar4);
    (*pWVar4->p->_vptr_Pipeline[2])(pWVar4->p,"\"datafile\": \"",0xd);
    JSON::Writer::encode_string(&local_110,data_filename);
    (*pWVar4->p->_vptr_Pipeline[2])(pWVar4->p,local_110._M_dataplus._M_p,local_110._M_string_length)
    ;
    (*pWVar4->p->_vptr_Pipeline[2])(pWVar4->p,"\"",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar1) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    Pl_Buffer::getString_abi_cxx11_(&local_110,&local_b8);
    pWVar4 = local_e8;
    Pipeline::writeString(local_c0,&local_110);
  }
  else {
    if (local_ec != qpdf_sj_inline) {
      plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error
                (plVar3,"QPDF_Stream::writeStreamJSON : unexpected value of json_data");
      __cxa_throw(plVar3,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    if (no_data_key) goto LAB_001fd5af;
    pWVar4 = JSON::Writer::writeNext(pWVar4);
    (*pWVar4->p->_vptr_Pipeline[2])(pWVar4->p,"\"data\": \"",9);
    Pl_Buffer::getString_abi_cxx11_(&local_110,&local_b8);
    pWVar4 = local_e8;
    sv._M_str = local_110._M_dataplus._M_p;
    sv._M_len = local_110._M_string_length;
    pWVar5 = JSON::Writer::writeBase64(local_e8,sv);
    (*pWVar5->p->_vptr_Pipeline[2])(pWVar5->p,"\"",1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar1) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
LAB_001fd5af:
  pWVar4 = JSON::Writer::writeNext(pWVar4);
  (*pWVar4->p->_vptr_Pipeline[2])(pWVar4->p,"\"dict\": ",8);
  QPDFObjectHandle::writeJSON(&local_d8,local_dc,local_e8,false);
  local_110._M_dataplus._M_p._0_1_ = 0x7d;
  JSON::Writer::writeEnd(local_e8,(char *)&local_110);
  if (local_d8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d8.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  Pl_Buffer::~Pl_Buffer(&local_b8);
  Pl_Discard::~Pl_Discard(&local_60);
  return decode_level;
}

Assistant:

qpdf_stream_decode_level_e
Stream::writeStreamJSON(
    int json_version,
    JSON::Writer& jw,
    qpdf_json_stream_data_e json_data,
    qpdf_stream_decode_level_e decode_level,
    Pipeline* p,
    std::string const& data_filename,
    bool no_data_key)
{
    auto s = stream();
    switch (json_data) {
    case qpdf_sj_none:
    case qpdf_sj_inline:
        if (p != nullptr) {
            throw std::logic_error(
                "QPDF_Stream::writeStreamJSON: pipeline should only be supplied "
                "when json_data is file");
        }
        break;
    case qpdf_sj_file:
        if (p == nullptr) {
            throw std::logic_error(
                "QPDF_Stream::writeStreamJSON: pipeline must be supplied when json_data is file");
        }
        if (data_filename.empty()) {
            throw std::logic_error(
                "QPDF_Stream::writeStreamJSON: data_filename must be supplied "
                "when json_data is file");
        }
        break;
    }

    jw.writeStart('{');

    if (json_data == qpdf_sj_none) {
        jw.writeNext();
        jw << R"("dict": )";
        s->stream_dict.writeJSON(json_version, jw);
        jw.writeEnd('}');
        return decode_level;
    }

    Pl_Discard discard;
    Pl_Buffer buf_pl{"stream data"};
    Pipeline* data_pipeline = &buf_pl;
    if (no_data_key && json_data == qpdf_sj_inline) {
        data_pipeline = &discard;
    }
    // pipeStreamData produced valid data.
    bool buf_pl_ready = false;
    bool filtered = false;
    bool filter = (decode_level != qpdf_dl_none);
    for (int attempt = 1; attempt <= 2; ++attempt) {
        bool succeeded =
            pipeStreamData(data_pipeline, &filtered, 0, decode_level, false, (attempt == 1));
        if (!succeeded || (filter && !filtered)) {
            // Try again
            filter = false;
            decode_level = qpdf_dl_none;
            buf_pl.getString(); // reset buf_pl
        } else {
            buf_pl_ready = true;
            break;
        }
    }
    if (!buf_pl_ready) {
        throw std::logic_error("QPDF_Stream: failed to get stream data");
    }
    // We can use unsafeShallowCopy because we are only touching top-level keys.
    auto dict = s->stream_dict.unsafeShallowCopy();
    dict.removeKey("/Length");
    if (filter && filtered) {
        dict.removeKey("/Filter");
        dict.removeKey("/DecodeParms");
    }
    if (json_data == qpdf_sj_file) {
        jw.writeNext() << R"("datafile": ")" << JSON::Writer::encode_string(data_filename) << "\"";
        p->writeString(buf_pl.getString());
    } else if (json_data == qpdf_sj_inline) {
        if (!no_data_key) {
            jw.writeNext() << R"("data": ")";
            jw.writeBase64(buf_pl.getString()) << "\"";
        }
    } else {
        throw std::logic_error("QPDF_Stream::writeStreamJSON : unexpected value of json_data");
    }

    jw.writeNext() << R"("dict": )";
    dict.writeJSON(json_version, jw);
    jw.writeEnd('}');

    return decode_level;
}